

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

_Bool cf_hc_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  _Bool _Var2;
  
  if ((cf->field_0x24 & 1) != 0) {
    _Var2 = (*cf->next->cft->has_data_pending)(cf->next,data);
    return _Var2;
  }
  pvVar1 = cf->ctx;
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"data_pending");
  }
  _Var2 = cf_hc_baller_data_pending((cf_hc_baller *)((long)pvVar1 + 0x28),data);
  if (_Var2) {
    return true;
  }
  _Var2 = cf_hc_baller_data_pending((cf_hc_baller *)((long)pvVar1 + 0x58),data);
  return _Var2;
}

Assistant:

static bool cf_hc_data_pending(struct Curl_cfilter *cf,
                               const struct Curl_easy *data)
{
  struct cf_hc_ctx *ctx = cf->ctx;

  if(cf->connected)
    return cf->next->cft->has_data_pending(cf->next, data);

  CURL_TRC_CF((struct Curl_easy *)data, cf, "data_pending");
  return cf_hc_baller_data_pending(&ctx->h3_baller, data)
         || cf_hc_baller_data_pending(&ctx->h21_baller, data);
}